

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O1

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  byte bVar1;
  uint uVar2;
  Descriptor *pDVar3;
  FieldDescriptor *pFVar4;
  TypeInfo *pTVar5;
  Cord *this_00;
  DynamicMessage *pDVar6;
  long *plVar7;
  bool bVar8;
  CppStringType CVar9;
  Nonnull<const_char_*> failure_msg;
  long lVar10;
  int iVar11;
  long lVar12;
  FieldDescriptor *this_01;
  long lVar13;
  DynamicMapField *this_02;
  LogMessageFatal local_40;
  
  pDVar3 = (this->type_info_->class_data).descriptor;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  lVar12 = (long)this->type_info_->extensions_offset;
  if (lVar12 != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar12));
  }
  if (0 < pDVar3->field_count_) {
    lVar12 = 0;
    lVar13 = 0;
    do {
      pFVar4 = pDVar3->fields_;
      this_01 = (FieldDescriptor *)(&pFVar4->super_SymbolBase + lVar12);
      if (((&pFVar4->field_0x3)[lVar12] & 1) == 0) {
LAB_00281055:
        uVar2 = (this->type_info_->offsets)._M_t.
                super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar13];
        bVar1 = (&pFVar4->field_0x1)[lVar12];
        bVar8 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 == bVar8) {
          failure_msg = (Nonnull<const_char_*>)0x0;
        }
        else {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar8,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (failure_msg != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
LAB_0028122b:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        this_02 = (DynamicMapField *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)uVar2);
        iVar11 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar4->type_)[lVar12] * 4);
        if (((&pFVar4->field_0x1)[lVar12] & 0x20) == 0) {
          if (iVar11 == 10) {
            pDVar6 = (DynamicMessage *)(this->type_info_->class_data).super_ClassData.prototype;
            if (pDVar6 != (DynamicMessage *)0x0 && pDVar6 != this) {
LAB_0028111b:
              plVar7 = (long *)(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_.
                               _M_i;
              if (plVar7 != (long *)0x0) {
                (**(code **)(*plVar7 + 8))();
              }
            }
          }
          else if (iVar11 == 9) {
            CVar9 = FieldDescriptor::cpp_string_type(this_01);
            if ((CVar9 == kView) || (CVar9 == kString)) {
LAB_00281132:
              internal::ArenaStringPtr::Destroy((ArenaStringPtr *)this_02);
            }
            else if (CVar9 == kCord) {
              absl::lts_20250127::Cord::~Cord((Cord *)this_02);
            }
          }
        }
        else {
          switch(iVar11) {
          case 1:
          case 8:
            RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_02);
            break;
          case 2:
            RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_02);
            break;
          case 3:
            RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_02);
            break;
          case 4:
            RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_02);
            break;
          case 5:
            RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_02);
            break;
          case 6:
            RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_02);
            break;
          case 7:
            RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_02);
            break;
          case 9:
            CVar9 = FieldDescriptor::cpp_string_type(this_01);
            if ((CVar9 == kView) || (CVar9 == kString)) {
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)this_02);
            }
            else if (CVar9 == kCord) {
              RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
                        ((RepeatedField<absl::lts_20250127::Cord> *)this_02);
            }
            break;
          case 10:
            if (((&pFVar4->type_)[lVar12] == 0xb) &&
               (bVar8 = FieldDescriptor::is_map_message_type(this_01), bVar8)) {
              internal::DynamicMapField::~DynamicMapField(this_02);
            }
            else {
              RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                        ((RepeatedPtrField<google::protobuf::Message> *)this_02);
            }
          }
        }
      }
      else {
        if (((&pFVar4->field_0x1)[lVar12] & 0x10) == 0) {
          lVar10 = 0;
        }
        else {
          lVar10 = *(long *)((long)&pFVar4->scope_ + lVar12);
          if (lVar10 == 0) {
            iVar11 = 0xb31;
            goto LAB_0028125c;
          }
        }
        if (lVar10 == 0) {
          iVar11 = 0xb63;
          goto LAB_0028125c;
        }
        if ((*(int *)(lVar10 + 4) == 1) && ((*(byte *)(*(long *)(lVar10 + 0x30) + 1) & 2) != 0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb64,"!res->is_synthetic()");
          goto LAB_0028122b;
        }
        if (((&pFVar4->field_0x3)[lVar12] & 1) == 0) goto LAB_00281055;
        lVar10 = *(long *)((long)&pFVar4->scope_ + lVar12);
        iVar11 = 0xb31;
        if (lVar10 == 0) {
LAB_0028125c:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,iVar11);
        }
        pTVar5 = this->type_info_;
        if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)((int)((ulong)(lVar10 - *(long *)(*(long *)(lVar10 + 0x10) + 0x48)) >> 3)
                           * -0x24924924 + pTVar5->oneof_case_offset)) !=
            *(int *)((long)&pFVar4->number_ + lVar12)) goto switchD_002810f0_default;
        lVar10 = *(long *)((long)&pFVar4->scope_ + lVar12);
        if (lVar10 == 0) goto LAB_0028125c;
        this_02 = (DynamicMapField *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)(pTVar5->offsets)._M_t.
                             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                             [(long)((int)((ulong)(lVar10 - *(long *)(*(long *)(lVar10 + 0x10) +
                                                                     0x48)) >> 3) * -0x49249249) +
                              (long)((pTVar5->class_data).descriptor)->field_count_]);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar4->type_)[lVar12] * 4) == 10
           ) goto LAB_0028111b;
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar4->type_)[lVar12] * 4) == 9)
        {
          CVar9 = FieldDescriptor::cpp_string_type(this_01);
          if ((CVar9 == kView) || (CVar9 == kString)) goto LAB_00281132;
          if ((CVar9 == kCord) &&
             (this_00 = (Cord *)(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_.
                                _M_i, this_00 != (Cord *)0x0)) {
            absl::lts_20250127::Cord::~Cord(this_00);
            operator_delete(this_00,0x10);
          }
        }
      }
switchD_002810f0_default:
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x58;
    } while (lVar13 < pDVar3->field_count_);
  }
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->class_data.descriptor;

  _internal_metadata_.Delete<UnknownFieldSet>();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(MutableExtensionsRaw())->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (InRealOneof(field)) {
      void* field_ptr = MutableOneofCaseRaw(field->containing_oneof()->index());
      if (*(reinterpret_cast<const int32_t*>(field_ptr)) == field->number()) {
        field_ptr = MutableOneofFieldRaw(field);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *reinterpret_cast<absl::Cord**>(field_ptr);
              break;
            case FieldDescriptor::CppStringType::kView:
              if (internal::EnableExperimentalMicroString()) {
                reinterpret_cast<MicroString*>(field_ptr)->Destroy();
                break;
              }
              [[fallthrough]];
            case FieldDescriptor::CppStringType::kString: {
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = MutableRaw(i);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              reinterpret_cast<RepeatedField<absl::Cord>*>(field_ptr)
                  ->~RepeatedField<absl::Cord>();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          reinterpret_cast<absl::Cord*>(field_ptr)->~Cord();
          break;
        case FieldDescriptor::CppStringType::kView:
          if (internal::EnableExperimentalMicroString()) {
            MutableRaw<MicroString>(i)->Destroy();
            break;
          }
          [[fallthrough]];
        case FieldDescriptor::CppStringType::kString: {
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != nullptr) {
          delete message;
        }
      }
    }
  }
}